

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkUpgradeToStruct
          (CompatibilityChecker *this,Reader *type,uint64_t structTypeId,
          Maybe<capnp::schema::Node::Reader> *matchSize,
          Maybe<capnp::schema::Field::Reader> *matchPosition)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  Impl *this_00;
  CapTableBuilder *pCVar5;
  undefined4 uVar6;
  anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Field::Reader>_2 *paVar7;
  ushort uVar8;
  SegmentBuilder *pSVar9;
  undefined4 uVar10;
  Maybe<capnp::schema::Field::Reader> *params_2;
  undefined2 uVar11;
  ArrayPtr<capnp::word> firstSegment;
  Reader value_00;
  Reader value_01;
  Builder value;
  Builder field;
  Builder result;
  Builder node;
  MallocMessageBuilder builder;
  word scratch [32];
  StructReader local_328;
  StructBuilder local_2f8;
  OrphanBuilder local_2c8;
  CompatibilityChecker *local_2a0;
  StructBuilder local_298;
  StructReader local_270;
  PointerBuilder local_240;
  MallocMessageBuilder local_228;
  word local_138 [33];
  
  params_2 = matchPosition;
  local_2a0 = this;
  memset(local_138,0,0x100);
  firstSegment.size_ = 0x20;
  firstSegment.ptr = local_138;
  MallocMessageBuilder::MallocMessageBuilder(&local_228,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_2f8,&local_228.super_MessageBuilder);
  local_328.data = local_2f8.data;
  local_328.segment = &(local_2f8.segment)->super_SegmentReader;
  local_328.capTable = &(local_2f8.capTable)->super_CapTableReader;
  _::PointerBuilder::initStruct(&local_298,(PointerBuilder *)&local_328,(StructSize)0x60006);
  *(uint64_t *)local_298.data = structTypeId;
  kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
            ((String *)&local_2f8,(kj *)"(unknown type used in ",(char (*) [23])&local_2a0->nodeName
             ,(Reader *)0x21d8d8,(char (*) [2])params_2);
  pSVar9 = local_2f8.segment;
  if ((SegmentBuilder *)local_2f8.capTable == (SegmentBuilder *)0x0) {
    pSVar9 = (SegmentBuilder *)0x203442;
  }
  value_00.super_StringPtr.content.size_ =
       (long)&((SegmentReader *)&(local_2f8.capTable)->super_CapTableReader)->arena +
       (ulong)((SegmentBuilder *)local_2f8.capTable == (SegmentBuilder *)0x0);
  local_328.segment = &(local_298.segment)->super_SegmentReader;
  local_328.capTable = &(local_298.capTable)->super_CapTableReader;
  local_328.data = local_298.pointers;
  value_00.super_StringPtr.content.ptr = (char *)pSVar9;
  _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_328,value_00);
  pSVar9 = local_2f8.segment;
  if (local_2f8.segment != (SegmentBuilder *)0x0) {
    local_2f8.segment = (SegmentBuilder *)0x0;
    local_2f8.capTable = (CapTableBuilder *)0x0;
    (*(code *)**local_2f8.data)(local_2f8.data,pSVar9,1);
  }
  *(undefined4 *)((long)local_298.data + 0xc) = 1;
  *(undefined4 *)((long)local_298.data + 0x18) = 0;
  *(byte *)((long)local_298.data + 0x1c) = *(byte *)((long)local_298.data + 0x1c) & 0xfe;
  *(undefined2 *)((long)local_298.data + 0x1e) = 0;
  *(undefined4 *)((long)local_298.data + 0x20) = 0;
  local_328.data = local_298.pointers + 3;
  local_328.segment = &(local_298.segment)->super_SegmentReader;
  local_328.capTable = &(local_298.capTable)->super_CapTableReader;
  _::PointerBuilder::clear((PointerBuilder *)&local_328);
  if ((type->_reader).dataSize < 0x10) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(type->_reader).data;
  }
  if (uVar8 < 0x13) {
    uVar11 = *(undefined2 *)(&DAT_0020baa0 + (uint)uVar8 * 2);
    *(undefined2 *)((long)local_298.data + 0xe) = *(undefined2 *)(&DAT_0020ba7a + (uint)uVar8 * 2);
    *(undefined2 *)((long)local_298.data + 0x18) = uVar11;
  }
  if ((matchSize->ptr).isSet == true) {
    pvVar3 = (matchSize->ptr).field_1.value._reader.data;
    uVar2 = *(uint *)((long)&(matchSize->ptr).field_1 + 0x20);
    if (uVar2 < 0x80) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(undefined2 *)((long)pvVar3 + 0xe);
    }
    *(undefined2 *)((long)local_298.data + 0xe) = uVar11;
    if (uVar2 < 0xd0) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(undefined2 *)((long)pvVar3 + 0x18);
    }
    *(undefined2 *)((long)local_298.data + 0x18) = uVar11;
  }
  local_2c8.capTable = (CapTableBuilder *)(local_298.pointers + 3);
  local_2c8.tag.content = (uint64_t)local_298.segment;
  local_2c8.segment = (SegmentBuilder *)local_298.capTable;
  _::PointerBuilder::initStructList
            ((ListBuilder *)&local_328,(PointerBuilder *)&local_2c8,1,(StructSize)0x40003);
  _::ListBuilder::getStructElement(&local_2f8,(ListBuilder *)&local_328,0);
  local_328.segment = &(local_2f8.segment)->super_SegmentReader;
  local_328.capTable = &(local_2f8.capTable)->super_CapTableReader;
  local_328.data = local_2f8.pointers;
  value_01.super_StringPtr.content.size_ = 8;
  value_01.super_StringPtr.content.ptr = "member0";
  _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_328,value_01);
  *(undefined2 *)local_2f8.data = 0;
  *(undefined2 *)((long)local_2f8.data + 8) = 0;
  *(undefined4 *)((long)local_2f8.data + 4) = 0;
  *(byte *)((long)local_2f8.data + 0x10) = *(byte *)((long)local_2f8.data + 0x10) & 0xfe;
  local_328.data = local_2f8.pointers + 2;
  local_328.segment = &(local_2f8.segment)->super_SegmentReader;
  local_328.capTable = &(local_2f8.capTable)->super_CapTableReader;
  _::PointerBuilder::clear((PointerBuilder *)&local_328);
  local_328.data = local_2f8.pointers + 3;
  local_328.segment = &(local_2f8.segment)->super_SegmentReader;
  local_328.capTable = &(local_2f8.capTable)->super_CapTableReader;
  _::PointerBuilder::clear((PointerBuilder *)&local_328);
  pvVar3 = local_2f8.data;
  pCVar5 = local_2f8.capTable;
  pSVar9 = local_2f8.segment;
  local_328.segment = (type->_reader).segment;
  local_328.capTable = (type->_reader).capTable;
  local_328.data = (type->_reader).data;
  local_328.pointers = (type->_reader).pointers;
  local_328.dataSize = (type->_reader).dataSize;
  local_328.pointerCount = (type->_reader).pointerCount;
  local_328._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
  local_328.nestingLimit = (type->_reader).nestingLimit;
  local_328._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
  local_2c8.capTable = (CapTableBuilder *)(local_2f8.pointers + 2);
  local_2c8.tag.content = (uint64_t)local_2f8.segment;
  local_2c8.segment = (SegmentBuilder *)local_2f8.capTable;
  _::PointerBuilder::setStruct((PointerBuilder *)&local_2c8,&local_328,false);
  bVar1 = (matchPosition->ptr).isSet;
  paVar7 = (anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Field::Reader>_2 *)0x0;
  if (bVar1 != false) {
    paVar7 = &(matchPosition->ptr).field_1;
  }
  if (bVar1 == true) {
    if ((*(uint *)((long)paVar7 + 0x20) < 0x60) ||
       (pvVar4 = (paVar7->value)._reader.data, *(short *)((long)pvVar4 + 10) != 1)) {
      *(undefined2 *)((long)((long)local_2f8.data + 8) + 2) = 0;
    }
    else {
      if (*(uint *)((long)paVar7 + 0x20) < 0x70) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(undefined2 *)((long)pvVar4 + 0xc);
      }
      *(undefined2 *)((long)((long)local_2f8.data + 8) + 2) = 1;
      *(undefined2 *)((long)((long)local_2f8.data + 8) + 4) = uVar11;
    }
    uVar8 = *(ushort *)((long)paVar7 + 0x24);
    uVar10 = 0;
    if (0x3f < *(uint *)((long)paVar7 + 0x20)) {
      uVar10 = *(undefined4 *)((long)(paVar7->value)._reader.data + 4);
    }
    local_328.segment = (paVar7->value)._reader.segment;
    local_328.capTable = (paVar7->value)._reader.capTable;
    local_328.data = (paVar7->value)._reader.pointers;
    uVar6 = *(undefined4 *)((long)paVar7 + 0x28);
    *(undefined4 *)((long)pvVar3 + 4) = uVar10;
    if (uVar8 < 4) {
      uVar6 = 0x7fffffff;
      local_328.capTable = (CapTableReader *)0x0;
      local_328.data = (WirePointer *)0x0;
      local_328.segment = (SegmentReader *)0x0;
    }
    else {
      local_328.data = (void *)((long)local_328.data + 0x18);
    }
    local_328.pointers = (WirePointer *)CONCAT44(local_328.pointers._4_4_,uVar6);
    _::PointerReader::getStruct(&local_270,(PointerReader *)&local_328,(word *)0x0);
    local_328.dataSize = local_270.dataSize;
    local_328.pointerCount = local_270.pointerCount;
    local_328._38_2_ = local_270._38_2_;
    local_328.nestingLimit = local_270.nestingLimit;
    local_328._44_4_ = local_270._44_4_;
    local_328.data = local_270.data;
    local_328.pointers = local_270.pointers;
    local_328.segment = local_270.segment;
    local_328.capTable = local_270.capTable;
    local_2c8.capTable = (CapTableBuilder *)(local_2f8.pointers + 3);
    local_2c8.tag.content = (uint64_t)pSVar9;
    local_2c8.segment = (SegmentBuilder *)pCVar5;
    _::PointerBuilder::setStruct((PointerBuilder *)&local_2c8,&local_328,false);
    goto switchD_001ad0cf_default;
  }
  *(undefined4 *)((long)((long)local_2f8.data + 8) + 2) = 1;
  *(undefined4 *)((long)pvVar3 + 4) = 0;
  local_2c8.capTable = (CapTableBuilder *)(local_2f8.pointers + 3);
  local_2c8.tag.content = (uint64_t)pSVar9;
  local_2c8.segment = (SegmentBuilder *)pCVar5;
  _::PointerBuilder::initStruct
            ((StructBuilder *)&local_328,(PointerBuilder *)&local_2c8,(StructSize)0x10002);
  if ((type->_reader).dataSize < 0x10) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(type->_reader).data;
  }
  switch(uVar11) {
  case 0:
    *(undefined2 *)local_328.data = 0;
    break;
  case 1:
    *(undefined2 *)local_328.data = 1;
    *(byte *)((long)local_328.data + 2) = *(byte *)((long)local_328.data + 2) & 0xfe;
    break;
  case 2:
    *(undefined2 *)local_328.data = 2;
    goto LAB_001ad374;
  case 3:
    *(undefined4 *)local_328.data = 3;
    break;
  case 4:
    *(undefined2 *)local_328.data = 4;
    goto LAB_001ad3bc;
  case 5:
    *(undefined2 *)local_328.data = 5;
    goto LAB_001ad30c;
  case 6:
    *(undefined2 *)local_328.data = 6;
LAB_001ad374:
    *(undefined1 *)((long)local_328.data + 2) = 0;
    break;
  case 7:
    *(undefined4 *)local_328.data = 7;
    break;
  case 8:
    *(undefined2 *)local_328.data = 8;
    goto LAB_001ad3bc;
  case 9:
    *(undefined2 *)local_328.data = 9;
    goto LAB_001ad30c;
  case 10:
    *(undefined2 *)local_328.data = 10;
LAB_001ad3bc:
    *(undefined4 *)((long)local_328.data + 4) = 0;
    break;
  case 0xb:
    *(undefined2 *)local_328.data = 0xb;
LAB_001ad30c:
    *(undefined8 *)((long)local_328.data + 8) = 0;
    break;
  case 0xc:
    local_2c8.capTable = (CapTableBuilder *)0x0;
    local_2c8.location = (word *)0x0;
    local_2c8.tag.content = 0;
    local_2c8.segment = (SegmentBuilder *)0x0;
    *(undefined2 *)local_328.data = 0xc;
    local_240.segment = (SegmentBuilder *)local_328.segment;
    local_240.capTable = (CapTableBuilder *)local_328.capTable;
    local_240.pointer = local_328.pointers;
    _::PointerBuilder::adopt(&local_240,&local_2c8);
    if (local_2c8.segment != (SegmentBuilder *)0x0) {
      _::OrphanBuilder::euthanize(&local_2c8);
    }
    break;
  case 0xd:
    local_2c8.capTable = (CapTableBuilder *)0x0;
    local_2c8.location = (word *)0x0;
    local_2c8.tag.content = 0;
    local_2c8.segment = (SegmentBuilder *)0x0;
    *(undefined2 *)local_328.data = 0xd;
    local_240.segment = (SegmentBuilder *)local_328.segment;
    local_240.capTable = (CapTableBuilder *)local_328.capTable;
    local_240.pointer = local_328.pointers;
    _::PointerBuilder::adopt(&local_240,&local_2c8);
    if (local_2c8.segment != (SegmentBuilder *)0x0) {
      _::OrphanBuilder::euthanize(&local_2c8);
    }
    break;
  case 0xe:
    *(undefined2 *)local_328.data = 0xe;
    local_2c8.tag.content = (uint64_t)local_328.segment;
    local_2c8.segment = (SegmentBuilder *)local_328.capTable;
    local_2c8.capTable = (CapTableBuilder *)local_328.pointers;
    _::PointerBuilder::clear((PointerBuilder *)&local_2c8);
    break;
  case 0xf:
    *(undefined4 *)local_328.data = 0xf;
    break;
  case 0x10:
    *(undefined2 *)local_328.data = 0x10;
    local_2c8.tag.content = (uint64_t)local_328.segment;
    local_2c8.segment = (SegmentBuilder *)local_328.capTable;
    local_2c8.capTable = (CapTableBuilder *)local_328.pointers;
    _::PointerBuilder::clear((PointerBuilder *)&local_2c8);
    break;
  case 0x11:
    *(undefined2 *)local_328.data = 0x11;
    break;
  case 0x12:
    *(undefined2 *)local_328.data = 0x12;
    local_2c8.tag.content = (uint64_t)local_328.segment;
    local_2c8.segment = (SegmentBuilder *)local_328.capTable;
    local_2c8.capTable = (CapTableBuilder *)local_328.pointers;
    _::PointerBuilder::clear((PointerBuilder *)&local_2c8);
  }
switchD_001ad0cf_default:
  this_00 = local_2a0->loader;
  _::StructBuilder::asReader(&local_298);
  Impl::load(this_00,(Reader *)&local_328,true);
  MallocMessageBuilder::~MallocMessageBuilder(&local_228);
  return;
}

Assistant:

void checkUpgradeToStruct(const schema::Type::Reader& type, uint64_t structTypeId,
                            kj::Maybe<schema::Node::Reader> matchSize = kj::none,
                            kj::Maybe<schema::Field::Reader> matchPosition = kj::none) {
    // We can't just look up the target struct and check it because it may not have been loaded
    // yet.  Instead, we contrive a struct that looks like what we want and load() that, which
    // guarantees that any incompatibility will be caught either now or when the real version of
    // that struct is loaded.

    word scratch[32];
    memset(scratch, 0, sizeof(scratch));
    MallocMessageBuilder builder(scratch);
    auto node = builder.initRoot<schema::Node>();
    node.setId(structTypeId);
    node.setDisplayName(kj::str("(unknown type used in ", nodeName, ")"));
    auto structNode = node.initStruct();

    switch (type.which()) {
      case schema::Type::VOID:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(0);
        break;

      case schema::Type::BOOL:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT8:
      case schema::Type::UINT8:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT16:
      case schema::Type::UINT16:
      case schema::Type::ENUM:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT32:
      case schema::Type::UINT32:
      case schema::Type::FLOAT32:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT64:
      case schema::Type::UINT64:
      case schema::Type::FLOAT64:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::LIST:
      case schema::Type::STRUCT:
      case schema::Type::INTERFACE:
      case schema::Type::ANY_POINTER:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(1);
        break;
    }

    KJ_IF_SOME(s, matchSize) {
      auto match = s.getStruct();
      structNode.setDataWordCount(match.getDataWordCount());
      structNode.setPointerCount(match.getPointerCount());
    }

    auto field = structNode.initFields(1)[0];
    field.setName("member0");
    field.setCodeOrder(0);
    auto slot = field.initSlot();
    slot.setType(type);

    KJ_IF_SOME(p, matchPosition) {
      if (p.getOrdinal().isExplicit()) {
        field.getOrdinal().setExplicit(p.getOrdinal().getExplicit());
      } else {
        field.getOrdinal().setImplicit();
      }
      auto matchSlot = p.getSlot();
      slot.setOffset(matchSlot.getOffset());
      slot.setDefaultValue(matchSlot.getDefaultValue());
    } else {
      field.getOrdinal().setExplicit(0);
      slot.setOffset(0);

      schema::Value::Builder value = slot.initDefaultValue();
      switch (type.which()) {
        case schema::Type::VOID: value.setVoid(); break;
        case schema::Type::BOOL: value.setBool(false); break;
        case schema::Type::INT8: value.setInt8(0); break;
        case schema::Type::INT16: value.setInt16(0); break;
        case schema::Type::INT32: value.setInt32(0); break;
        case schema::Type::INT64: value.setInt64(0); break;
        case schema::Type::UINT8: value.setUint8(0); break;
        case schema::Type::UINT16: value.setUint16(0); break;
        case schema::Type::UINT32: value.setUint32(0); break;
        case schema::Type::UINT64: value.setUint64(0); break;
        case schema::Type::FLOAT32: value.setFloat32(0); break;
        case schema::Type::FLOAT64: value.setFloat64(0); break;
        case schema::Type::ENUM: value.setEnum(0); break;
        case schema::Type::TEXT: value.adoptText(Orphan<Text>()); break;
        case schema::Type::DATA: value.adoptData(Orphan<Data>()); break;
        case schema::Type::LIST: value.initList(); break;
        case schema::Type::STRUCT: value.initStruct(); break;
        case schema::Type::INTERFACE: value.setInterface(); break;
        case schema::Type::ANY_POINTER: value.initAnyPointer(); break;
      }
    }